

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

archive_wstring * archive_wstring_append(archive_wstring *as,wchar_t *p,size_t s)

{
  archive_wstring *paVar1;
  size_t s_local;
  wchar_t *p_local;
  archive_wstring *as_local;
  
  paVar1 = archive_wstring_ensure(as,as->length + s + 1);
  if (paVar1 == (archive_wstring *)0x0) {
    as_local = (archive_wstring *)0x0;
  }
  else {
    wmemcpy(as->s + as->length,p,s);
    as->length = s + as->length;
    as->s[as->length] = L'\0';
    as_local = as;
  }
  return as_local;
}

Assistant:

static struct archive_wstring *
archive_wstring_append(struct archive_wstring *as, const wchar_t *p, size_t s)
{
	if (archive_wstring_ensure(as, as->length + s + 1) == NULL)
		return (NULL);
	wmemcpy(as->s + as->length, p, s);
	as->length += s;
	as->s[as->length] = 0;
	return (as);
}